

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__decode_jpeg_header(stbi__jpeg *z,int scan)

{
  stbi__context *psVar1;
  stbi_uc sVar2;
  byte bVar3;
  int iVar4;
  uint m;
  
  z->jfif = 0;
  z->app14_color_transform = -1;
  z->marker = 0xff;
  sVar2 = stbi__get_marker(z);
  if (sVar2 == 0xd8) {
    iVar4 = 1;
    if (scan != 1) {
      bVar3 = stbi__get_marker(z);
      m = (uint)bVar3;
      if (bVar3 != 0xc2 && (m & 0xfffffffe) != 0xc0) {
        do {
          iVar4 = stbi__process_marker(z,m);
          if (iVar4 == 0) {
            return 0;
          }
LAB_00113fd2:
          bVar3 = stbi__get_marker(z);
          if (bVar3 == 0xff) {
            psVar1 = z->s;
            if ((psVar1->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) goto code_r0x00113fe8;
            goto LAB_00113ffb;
          }
        } while ((bVar3 != 0xc2) && (m = (uint)bVar3, (m & 0xfffffffe) != 0xc0));
      }
      z->progressive = (uint)(bVar3 == 0xc2);
      iVar4 = stbi__process_frame_header(z,scan);
      return iVar4;
    }
  }
  else {
    stbi__g_failure_reason = "no SOI";
    iVar4 = 0;
  }
  return iVar4;
code_r0x00113fe8:
  iVar4 = (*(psVar1->io).eof)(psVar1->io_user_data);
  if (iVar4 != 0) {
    if (psVar1->read_from_callbacks != 0) {
LAB_00113ffb:
      if (psVar1->img_buffer < psVar1->img_buffer_end) goto LAB_00113fd2;
    }
    stbi__g_failure_reason = "no SOF";
    return 0;
  }
  goto LAB_00113fd2;
}

Assistant:

static int stbi__decode_jpeg_header(stbi__jpeg *z, int scan)
{
   int m;
   z->jfif = 0;
   z->app14_color_transform = -1; // valid values are 0,1,2
   z->marker = STBI__MARKER_none; // initialize cached marker to empty
   m = stbi__get_marker(z);
   if (!stbi__SOI(m)) return stbi__err("no SOI","Corrupt JPEG");
   if (scan == STBI__SCAN_type) return 1;
   m = stbi__get_marker(z);
   while (!stbi__SOF(m)) {
      if (!stbi__process_marker(z,m)) return 0;
      m = stbi__get_marker(z);
      while (m == STBI__MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (stbi__at_eof(z->s)) return stbi__err("no SOF", "Corrupt JPEG");
         m = stbi__get_marker(z);
      }
   }
   z->progressive = stbi__SOF_progressive(m);
   if (!stbi__process_frame_header(z, scan)) return 0;
   return 1;
}